

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

int __thiscall
CommandDrawInventoryBar::GetCounterSpacing(CommandDrawInventoryBar *this,DSBarInfo *statusBar)

{
  int iVar1;
  FTexture *this_00;
  uint index;
  
  index = statusBar->invBarOffset + 2;
  if (this->style != STYLE_Strife) {
    index = statusBar->invBarOffset;
  }
  this_00 = FImageCollection::operator[](&statusBar->Images,index);
  if (this_00 == (FTexture *)0x0) {
    iVar1 = 0x20;
  }
  else {
    if (this->vertical == false) {
      iVar1 = FTexture::GetScaledWidth(this_00);
    }
    else {
      iVar1 = FTexture::GetScaledHeight(this_00);
    }
    iVar1 = iVar1 + (uint)(this->style != STYLE_Strife) * 2 + -1;
  }
  return iVar1;
}

Assistant:

int GetCounterSpacing(const DSBarInfo *statusBar) const
		{
			FTexture *box = (style != STYLE_Strife)
				? statusBar->Images[statusBar->invBarOffset + imgARTIBOX]
				: statusBar->Images[statusBar->invBarOffset + imgCURSOR];
			if (box == NULL)
			{ // Don't crash without a graphic.
				return 32;
			}
			else
			{
				int spacing;
				if (!vertical)
				{
					spacing = box->GetScaledWidth();
				}
				else
				{
					spacing = box->GetScaledHeight();
				}
				return spacing + ((style != STYLE_Strife) ? 1 : -1);
			}
		}